

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSGDiscrete.cpp
# Opt level: O0

void __thiscall POSGDiscrete::~POSGDiscrete(POSGDiscrete *this,void **vtt)

{
  bool bVar1;
  iterator this_00;
  reference ppRVar2;
  vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_> *in_RSI;
  __normal_iterator<RewardModelMapping_**,_std::vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>_>
  *in_RDI;
  iterator it;
  vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_> *in_stack_ffffffffffffffb8;
  RewardModelMapping *in_stack_ffffffffffffffc0;
  __normal_iterator<RewardModelMapping_**,_std::vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>_>
  in_stack_ffffffffffffffd8;
  __normal_iterator<RewardModelMapping_**,_std::vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>_>
  local_18 [3];
  
  in_RDI->_M_current =
       (in_RSI->super__Vector_base<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>).
       _M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(in_RDI->_M_current[-10]->super_RewardModel).super_RewardModelDiscreteInterface.
           super_QTableInterface._vptr_QTableInterface + (long)&in_RDI->_M_current) =
       in_RSI[3].super__Vector_base<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(in_RDI->_M_current[-9]->super_RewardModel).super_RewardModelDiscreteInterface.
           super_QTableInterface._vptr_QTableInterface + (long)&in_RDI->_M_current) =
       in_RSI[3].super__Vector_base<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(in_RDI->_M_current[-8]->super_RewardModel).super_RewardModelDiscreteInterface.
           super_QTableInterface._vptr_QTableInterface + (long)&in_RDI->_M_current) =
       in_RSI[3].super__Vector_base<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  *(pointer *)
   ((long)&(in_RDI->_M_current[-0xb]->super_RewardModel).super_RewardModelDiscreteInterface.
           super_QTableInterface._vptr_QTableInterface + (long)&in_RDI->_M_current) =
       in_RSI[4].super__Vector_base<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  in_RDI[0x40]._M_current =
       in_RSI[4].super__Vector_base<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_18[0]._M_current =
       (RewardModelMapping **)
       std::vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>::begin
                 (in_stack_ffffffffffffffb8);
  while( true ) {
    this_00 = std::vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>::end
                        (in_stack_ffffffffffffffb8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<RewardModelMapping_**,_std::vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<RewardModelMapping_**,_std::vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    ppRVar2 = __gnu_cxx::
              __normal_iterator<RewardModelMapping_**,_std::vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>_>
              ::operator*(local_18);
    in_stack_ffffffffffffffc0 = *ppRVar2;
    if (in_stack_ffffffffffffffc0 != (RewardModelMapping *)0x0) {
      (*(in_stack_ffffffffffffffc0->super_RewardModel).super_RewardModelDiscreteInterface.
        super_QTableInterface._vptr_QTableInterface[3])();
    }
    in_stack_ffffffffffffffd8 =
         __gnu_cxx::
         __normal_iterator<RewardModelMapping_**,_std::vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>_>
         ::operator++(in_RDI,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  }
  std::vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>::~vector(in_RSI);
  POSG::~POSG((POSG *)in_stack_ffffffffffffffc0,(void **)in_stack_ffffffffffffffb8);
  MultiAgentDecisionProcessDiscrete::~MultiAgentDecisionProcessDiscrete
            ((MultiAgentDecisionProcessDiscrete *)this_00._M_current,
             in_stack_ffffffffffffffd8._M_current);
  return;
}

Assistant:

POSGDiscrete::~POSGDiscrete()
{
    if(DEBUG_DPOMDPD)
        cout << "deleting POSGDiscrete (deleting rewards)"<<endl;
    for(vector<RewardModelMapping*>::iterator it = _m_p_rModel.begin();
            it != _m_p_rModel.end(); it++)
        delete *it;
}